

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O2

void __thiscall QInputDialogPrivate::plainTextEditTextChanged(QInputDialogPrivate *this)

{
  QInputDialog *this_00;
  bool bVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QInputDialog **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QPlainTextEdit::toPlainText((QString *)&local_38,this->plainTextEdit);
  bVar1 = ::operator!=(&this->textValue,(QString *)&local_38);
  if (bVar1) {
    QString::operator=(&this->textValue,(QString *)&local_38);
    QInputDialog::textValueChanged(this_00,(QString *)&local_38);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QInputDialogPrivate::plainTextEditTextChanged()
{
    Q_Q(QInputDialog);
    QString text = plainTextEdit->toPlainText();
    if (textValue != text) {
        textValue = text;
        emit q->textValueChanged(text);
    }
}